

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Solution
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZVec<double> *qsi,int var,
          TPZVec<double> *sol)

{
  TPZMaterialDataT<double> *this_00;
  int in_EDX;
  TPZInterpolationSpace *in_RDI;
  bool hasPhi;
  TPZMaterialDataT<double> data;
  undefined7 in_stack_ffffffffffff7d78;
  undefined1 in_stack_ffffffffffff7d7f;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7d80;
  TPZVec<double> *in_stack_ffffffffffff7d88;
  TPZVec<double> *qsi_00;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7db0;
  TPZVec<TPZManVector<double,_10>_> local_3980 [460];
  
  if (in_EDX == 99) {
    TPZInterpolationSpace::Solution
              (in_RDI,in_stack_ffffffffffff7d88,(int)((ulong)in_stack_ffffffffffff7d80 >> 0x20),
               (TPZVec<double> *)CONCAT17(in_stack_ffffffffffff7d7f,in_stack_ffffffffffff7d78));
  }
  else {
    qsi_00 = (TPZVec<double> *)&stack0xffffffffffff7db0;
    TPZMaterialDataT<double>::TPZMaterialDataT(in_stack_ffffffffffff7db0);
    TPZInterpolationSpace::ComputeSolution
              (in_RDI,qsi_00,in_stack_ffffffffffff7d80,(bool)in_stack_ffffffffffff7d7f);
    this_00 = (TPZMaterialDataT<double> *)
              TPZVec<TPZManVector<double,_10>_>::operator[](local_3980,0);
    TPZVec<double>::operator=((TPZVec<double> *)in_RDI,qsi_00);
    TPZMaterialDataT<double>::~TPZMaterialDataT(this_00);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>:: Solution(TPZVec<REAL> &qsi,int var,TPZVec<STATE> &sol)
{
    //TODOCOMPLEX
    if (var == 99) {
        return TPZIntelGen<TSHAPE>::Solution(qsi,var,sol);
    }
    TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
    this->ComputeSolution(qsi,data,hasPhi);
    sol = std::move(data.sol[0]);
}